

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rldata.hpp
# Opt level: O0

bool __thiscall relive::Station::needsUpdate(Station *this,Station *ns)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  undefined1 local_11;
  
  local_11 = true;
  if ((*(long *)(in_RDI + 8) == *(long *)(in_RSI + 8)) &&
     (local_11 = true, *(int *)(in_RDI + 0x10) == *(int *)(in_RSI + 0x10))) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (in_RDI + 0x18),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (in_RSI + 0x18));
    local_11 = true;
    if ((!bVar1) && (local_11 = true, *(int *)(in_RDI + 0x40) == *(int *)(in_RSI + 0x40))) {
      local_11 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(in_RDI + 0x48),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(in_RSI + 0x48));
    }
  }
  return local_11;
}

Assistant:

bool needsUpdate(const Station& ns)
    {
        return (_reliveId != ns._reliveId || _protocol != ns._protocol || _name != ns._name || _flags != ns._flags || _metaInfo != ns._metaInfo);
    }